

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

double __thiscall nnad::Matrix<double>::Determinant(Matrix<double> *this)

{
  ostream *poVar1;
  int iVar2;
  double dVar3;
  Matrix<double> Cofactor;
  int local_68 [2];
  Matrix<double> local_60;
  double local_40;
  double local_38;
  double local_30;
  
  if (this->_Lines != this->_Columns) {
    local_60._0_8_ =
         &local_60._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Determinant: matrix must be square.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_60._0_8_,
                        (long)local_60._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(-10);
  }
  if (this->_Lines == 1) {
    local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
    local_68[0] = 0;
    local_30 = GetElement(this,&local_60._Lines,local_68);
  }
  else {
    local_68[0] = 0;
    if (this->_Lines < 1) {
      local_30 = 0.0;
    }
    else {
      local_30 = 0.0;
      iVar2 = 1;
      do {
        GetCofactor(&local_60,this,0,local_68[0]);
        local_68[1] = 0;
        local_38 = GetElement(this,local_68 + 1,local_68);
        dVar3 = Determinant(&local_60);
        if (local_60._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          local_40 = dVar3;
          operator_delete(local_60._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60._Matrix.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60._Matrix.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          dVar3 = local_40;
        }
        local_30 = local_30 + local_38 * (double)iVar2 * dVar3;
        iVar2 = -iVar2;
        local_68[0] = local_68[0] + 1;
      } while (local_68[0] < this->_Lines);
    }
  }
  return local_30;
}

Assistant:

T Determinant()
    {
      if (_Lines != _Columns)
        Error("Determinant: matrix must be square.");

      T D = 0; // Initialize result

      //  Base case : if matrix contains single element
      if (_Lines == 1)
        return this->GetElement(0,0);

      // To store sign multiplier
      int sign = 1;

      // Iterate for each element of first row
      for (int f = 0; f < _Lines; f++)
        {
          // Getting Cofactor
          Matrix<T> Cofactor = this->GetCofactor(0, f);
          D += sign * this->GetElement(0, f) * Cofactor.Determinant();

          // terms are to be added with alternate sign
          sign = -sign;
        }
      return D;
    }